

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O3

int __thiscall
FormatTypeSCP::SaveDisk
          (FormatTypeSCP *this,char *file_path,IDisk *disk,ILoadingProgress *loading_progress)

{
  undefined4 uVar1;
  char *pcVar2;
  uint uVar3;
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  ulong uVar8;
  byte bVar9;
  int iVar10;
  uint uVar11;
  undefined2 *__ptr;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char cVar16;
  ushort uVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  FILE *file;
  uchar buffer [680];
  FILE *local_308;
  int local_2fc;
  undefined8 local_2f8;
  Side *local_2f0;
  ulong local_2e8;
  IDisk *local_2e0;
  undefined1 local_2d8 [7];
  char local_2d1;
  undefined2 local_2d0;
  undefined1 local_2ce;
  int local_2cc;
  int aiStack_2c8 [166];
  
  iVar20 = 0;
  memset(local_2d8,0,0x2a8);
  uVar23 = disk->side_[0].nb_tracks;
  uVar11 = disk->side_[1].nb_tracks;
  uVar3 = uVar23 + uVar11;
  if (uVar11 == 0) {
    uVar3 = uVar23 * 2;
  }
  iVar10 = IDisk::SmartOpen(disk,(FILE **)&local_308,file_path,".SCP");
  if (iVar10 == 0) {
    local_2d8[2] = 0x50;
    local_2d8._0_2_ = 0x4353;
    local_2d8._3_4_ = 0x10011;
    local_2d1 = (char)uVar3 + -1;
    local_2d0 = 0;
    local_2ce = 2;
    fwrite(local_2d8,0x2a8,1,local_308);
    if (0 < (int)uVar3) {
      local_2f0 = disk->side_;
      local_2fc = 0x2a8;
      uVar23 = 0;
      iVar20 = 0;
      local_2f8 = 0;
      local_2e8 = (ulong)uVar3;
      local_2e0 = disk;
      do {
        if ((disk->side_[1].nb_tracks == 0) || (disk->nb_sides_ == '\x01')) {
          uVar11 = 0;
        }
        else {
          uVar11 = uVar23 & 1;
        }
        lVar14 = *(long *)((long)&local_2f0->tracks + (ulong)(uVar11 << 4));
        lVar19 = (ulong)(uVar23 >> 1) * 0x20;
        uVar11 = *(uint *)(lVar14 + 0x18 + lVar19);
        uVar13 = 200000000 / (long)(int)(uVar11 * 0x19);
        uVar12 = uVar13 & 0xffffffff;
        aiStack_2c8[uVar23] = local_2fc;
        __ptr = (undefined2 *)operator_new__((long)(int)uVar11 * 2 + 0x40);
        disk = local_2e0;
        uVar8 = local_2e8;
        uVar15 = (ulong)uVar11;
        *__ptr = 0x5254;
        *(undefined1 *)(__ptr + 1) = 0x4b;
        *(char *)((long)__ptr + 3) = (char)local_2f8;
        *(undefined4 *)(__ptr + 2) = 8000000;
        *(undefined4 *)(__ptr + 6) = 0x10;
        uVar22 = 1;
        if (1 < (ulong)(long)(int)uVar11) {
          pcVar2 = *(char **)(lVar14 + 0x10 + lVar19);
          cVar16 = *pcVar2;
          uVar21 = 1;
          do {
            uVar22 = uVar21;
            if ((cVar16 == '\x01') || (cVar16 = pcVar2[uVar21], cVar16 == '\0')) break;
            uVar21 = uVar21 + 1;
            uVar22 = uVar15;
          } while (uVar15 != uVar21);
        }
        if ((int)uVar11 < 1) {
          iVar10 = 0;
          uVar21 = 0x10;
        }
        else {
          uVar23 = 0;
          uVar21 = 0x10;
          iVar27 = (int)uVar13;
          iVar10 = 0;
          do {
            uVar3 = uVar23 + 1;
            if ((int)(uVar23 + 1) < (int)uVar11) {
              uVar3 = uVar11;
            }
            uVar26 = uVar13 & 0xffffffff;
            do {
              uVar25 = (uint)uVar26;
              uVar18 = (uint)uVar12;
              uVar24 = uVar23;
              if ((*(byte *)(*(long *)(lVar19 + lVar14 + 0x10) +
                            (ulong)((int)uVar22 + uVar23) % uVar15) & 1) != 0) break;
              uVar25 = uVar25 + iVar27;
              uVar26 = (ulong)uVar25;
              uVar18 = uVar18 + iVar27;
              uVar12 = (ulong)uVar18;
              uVar23 = uVar23 + 1;
              uVar24 = uVar3;
            } while (uVar3 != uVar23);
            uVar23 = uVar24 + 1;
            iVar28 = (int)(long)(((double)(int)uVar24 + 1.0) *
                                (200000000.0 / ((double)(int)uVar11 * 25.0)));
            uVar12 = (ulong)(uint)(iVar27 + iVar28);
            uVar17 = (ushort)((iVar28 - uVar18) + uVar25);
            *(ushort *)((long)__ptr + uVar21) = uVar17 << 8 | uVar17 >> 8;
            uVar21 = uVar21 + 2;
            iVar10 = iVar10 + 1;
          } while ((int)uVar23 < (int)uVar11);
        }
        *(int *)(__ptr + 4) = iVar10;
        uVar13 = 0;
        do {
          iVar20 = iVar20 + (uint)*(byte *)((long)__ptr + uVar13);
          uVar13 = uVar13 + 1;
        } while ((uVar21 & 0xffffffff) != uVar13);
        local_2fc = local_2fc + (int)uVar21;
        fwrite(__ptr,uVar21 & 0xffffffff,1,local_308);
        operator_delete__(__ptr);
        bVar9 = (char)local_2f8 + 1;
        local_2f8 = CONCAT71((int7)((ulong)local_2f8 >> 8),bVar9);
        uVar23 = (uint)bVar9;
      } while ((int)uVar23 < (int)uVar8);
    }
    iVar10 = 0;
    iVar27 = 0;
    iVar28 = 0;
    lVar14 = 0x10;
    do {
      uVar1 = *(undefined4 *)(local_2d8 + lVar14);
      uVar13 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar13;
      auVar4[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar5[8] = (char)((uint)uVar1 >> 0x10);
      auVar5._0_8_ = uVar13;
      auVar5[9] = 0;
      auVar5._10_3_ = auVar4._10_3_;
      auVar7._5_8_ = 0;
      auVar7._0_5_ = auVar5._8_5_;
      auVar6[4] = (char)((uint)uVar1 >> 8);
      auVar6._0_4_ = (int)uVar13;
      auVar6[5] = 0;
      auVar6._6_7_ = SUB137(auVar7 << 0x40,6);
      iVar20 = iVar20 + (int)uVar13;
      iVar10 = iVar10 + auVar6._4_4_;
      iVar27 = iVar27 + auVar5._8_4_;
      iVar28 = iVar28 + (uint)(uint3)(auVar4._10_3_ >> 0x10);
      lVar14 = lVar14 + 4;
    } while (lVar14 != 0x2a8);
    local_2cc = iVar28 + iVar10 + iVar27 + iVar20;
    fseek(local_308,0,0);
    fwrite(local_2d8,0x2a8,1,local_308);
    disk->disk_modified_ = false;
    fclose(local_308);
  }
  return 0;
}

Assistant:

int FormatTypeSCP::SaveDisk(const char* file_path, IDisk* disk, ILoadingProgress* loading_progress) const
{
   unsigned int checksum = 0;
   int ret = 0;
   int i;
   FILE* file;
   int offset = 0;
   unsigned char buffer[0x2A8] = {0};

   unsigned char* pTrackBuffer; // = new unsigned char[m_Disk[0].NbTracks + m_Disk[1].NbTracks];
   //int*pTrackBufferSize = new int [m_Disk[0].NbTracks + m_Disk[1].NbTracks];

   int nbSideToRecord = (disk->side_[1].nb_tracks == 0)
                           ? disk->side_[0].nb_tracks * 2
                           : disk->side_[0].nb_tracks + disk->side_[1].nb_tracks;

   int res = disk->SmartOpen(&file, file_path, ".SCP");

   if (res == 0)
   {
      // First part
      memcpy(&buffer[offset], "SCP", 3);
      offset += 3;
      buffer[offset++] = 0x11;
      buffer[offset++] = 0x00;
      buffer[offset++] = 0x01; // One revolution only
      buffer[offset++] = 0x00; // Start track
      buffer[offset++] = nbSideToRecord - 1; // End track
      buffer[offset++] = 0x00; // Flags bits
      buffer[offset++] = 0x00; // Bit cell encoding
      buffer[offset++] = 0x02; // Two side...

      offset += 1; // Reserved

      // checksum is added later
      offset = 0x2A8;
      // Tracks
      // CHEAT : If no 2nd side is recorded, just record twice the first one....


      checksum = 0;

      // Write begining...
      fwrite(buffer, 0x2A8, 1, file);

      for (unsigned char track = 0; track < nbSideToRecord; track++)
      {
         int side = (disk->side_[1].nb_tracks == 0 || disk->nb_sides_ == 1 ) ? 0 : track % 2;

         int dskTrack = /*(m_Disk[1].NbTracks==0)?track:*/track >> 1;

         int tracklength = disk->side_[side].tracks[dskTrack]/*.Revolution[0]*/.size;

         // Taille de la clock :
         // Pour un bitcell a 2us :
         // int clock = 2000 / 25; // 2 us
         // Pour un bitcell a 200ms / tracklength
         int clock = 200000000 /(25* tracklength);


         // Set the offset
         int offset_track = 0;

         // Add to header buffer
         AddIntToBuffer(buffer, 0x10 + track * sizeof(int), offset);

         // Compute max length of the buffer
         // Allocate max possible buffer
         pTrackBuffer/*[track]*/ = new unsigned char[tracklength * 2 + 0x40];
         // Max is transition every cells : 16 bits / transitions

         // Header
         memcpy(&pTrackBuffer/*[track]*/[offset_track], "TRK", 3);
         offset_track += 3;
         pTrackBuffer/*[track]*/[offset_track++] = track; // (track<<1)|track%2;

         // INDEX TIME = 32 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE REVOLUTION
         unsigned int index_time = tracklength * clock;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x04, 0x7A1200); // 200 ms for one revolution - TODO : TO ADJUST ?

         // Offset of revolution
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x0C, 0x10);

         offset_track = 0x10;
         // TRACK DATA = 16 BIT VALUE, TIME IN NANOSECONDS/25ns FOR ONE BIT CELL TIME
         int length = 0;
         //
         i = 0;

         // First bit : Depends on the last bit of the track
         // In fact, it it necessary to adjust to last '0' (or first '0' ) of the track, close to the index

         // If zero, dont begin with
         unsigned short flux = clock;
         unsigned int total_flux = clock;

         unsigned int index_on_track = 1;
         // Search for nearest '10'
         while (index_on_track < tracklength && disk->side_[side].tracks[dskTrack].bitfield[index_on_track-1] != 1 && disk->side_[side].tracks[dskTrack].bitfield[index_on_track ] != 0)
         {
            index_on_track++;
         }

         // HACK for "Reussir"
         /*
         if (track == 38)
         {
            index_on_track = 34950;
         }*/
         
         while (i < tracklength)
         {
            // Wait for next flux reversal
            // Handle weak bits (todo)

            while (i < tracklength && (disk->side_[side].tracks[dskTrack].bitfield[(i+index_on_track)%tracklength]&0x1) == 0x00)
            {
               // Overflow handling ?
               if ((int)(flux + clock) >= 0x10000)
               {
                  // Overflow handling TODO
               }

               flux += clock;
               total_flux += clock;
               ++i;
            }

            // Adjust bitcell to reach 200ms track
            double ratio = (double)i / (double)tracklength;
            double current = clock * (i+1);
            double total_aimed = 200000000.0 / (25.0 * (double)tracklength) * (double)(i+1.0);

            unsigned int adujst = (unsigned int)total_aimed - total_flux;
            total_flux += adujst; // NON
            flux += adujst; // NON

            // New one : Write it, and begin a new sequence
            AddShortToBuffer(pTrackBuffer/*[track]*/, offset_track, flux);
            //checksum += flux;

            offset_track += 2;
            length++;
            ++i;
            flux = clock;
            total_flux += clock;
         }
         // Last offset
         /*AddShortToBuffer ( pTrackBuffer[track], offsetTrack , flux );
         offsetTrack += 2;
         length++;*/

         //
         //pTrackBufferSize[track] = offsetTrack;
         // Track length
         offset += offset_track;
         AddIntToBuffer(pTrackBuffer/*[track]*/, 0x08, length); // 200 ms for one revolution - TODO : TO ADJUST ?

         for (int crc = 0; crc < offset_track; crc++)
         {
            checksum += pTrackBuffer[crc];
         }

         fwrite(pTrackBuffer, offset_track, 1, file);
         delete[]pTrackBuffer;
      }

      // Timestamp


      // --- Checksum : Compute it
      // Header
      for (i = 0x10; i < 0x2A8; i++) checksum += buffer[i];
      // Write it
      // Timestamp
      // TODO

      // Write it
      memcpy(&buffer[0x0C], (unsigned int*)&checksum, 4);
      /*buffer[0x0C] =  (checksum & 0xFF);
      buffer[0x0D] =  ((checksum>>1) & 0xFF);
      buffer[0x0E] =  ((checksum>>2) & 0xFF);
      buffer[0x0F] =  ((checksum>>3) & 0xFF);*/

      // --- Write buffers
      // Go back to begining of file
      fseek(file, 0, SEEK_SET);
      fwrite(buffer, 0x2A8, 1, file);

      /*// Track buffers
      for (int track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
      {
      fwrite ( pTrackBuffer[track],  pTrackBufferSize[track], 1, file) ;
      }

      */

      disk->disk_modified_ = false;
      fclose(file);
   }

   //delete []pTrackBufferSize;

   /*for (unsigned char track = 0; track < m_Disk[0].NbTracks + m_Disk[1].NbTracks; track ++)
   delete (pTrackBuffer[track]);
   delete []pTrackBuffer;*/

   return 0;
}